

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateCMessage
               (Descriptor *message,Printer *printer)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *this;
  undefined8 uVar1;
  int iVar2;
  WellKnownType WVar3;
  int iVar4;
  DescriptorStringView psVar5;
  FileDescriptor *this_00;
  DescriptorStringView psVar6;
  Descriptor *message_00;
  EnumDescriptor *desc;
  FileDescriptor *file;
  undefined1 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined1 auVar9 [16];
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  int local_310;
  int local_30c;
  int i_5;
  int i_4;
  string_view local_2f8;
  string_view local_2e8;
  undefined1 local_2d8 [16];
  string local_2c8;
  string_view local_2a8;
  OneofDescriptor *local_298;
  OneofDescriptor *oneof_1;
  undefined1 auStack_288 [4];
  int i_3;
  undefined8 local_280;
  string local_278;
  string_view local_258;
  FieldDescriptor *local_248;
  FieldDescriptor *field_1;
  undefined1 auStack_238 [4];
  int i_2;
  string_view local_228;
  string_view local_218;
  undefined1 local_208 [16];
  string local_1f8;
  string_view local_1d8;
  OneofDescriptor *local_1c8;
  OneofDescriptor *oneof;
  undefined1 auStack_1b8 [4];
  int i_1;
  undefined8 local_1b0;
  string local_1a8;
  string_view local_188;
  FieldDescriptor *local_178;
  FieldDescriptor *field;
  undefined1 local_168 [4];
  int i;
  string_view local_148;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_118;
  undefined8 local_110;
  Options local_f8;
  string local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  string php_name;
  undefined1 local_38 [8];
  string c_name;
  Printer *printer_local;
  Descriptor *message_local;
  
  c_name.field_2._8_8_ = printer;
  psVar5 = Descriptor::full_name_abi_cxx11_(message);
  auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
  this = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *)((long)&php_name.field_2 + 8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (this,(char (*) [2])0x6da370,(char (*) [2])0x6bc912);
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(local_38,auVar9._0_8_,auVar9._8_8_,this,1);
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = (ctrl_t *)0x0;
  local_f8.is_descriptor = false;
  local_f8.aggregate_metadata = false;
  local_f8.gen_c_wkt = false;
  local_f8._3_5_ = 0;
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)0x0;
  php::Options::Options(&local_f8);
  FullClassName<google::protobuf::Descriptor>(&local_c8,message,&local_f8);
  local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_138,(char (*) [2])0x55718b,(char (*) [3])"\\\\");
  local_118 = &local_138;
  local_110 = 1;
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(local_98,local_a8._0_8_,local_a8._8_8_,local_118,1);
  std::__cxx11::string::~string((string *)&local_c8);
  php::Options::~Options(&local_f8);
  uVar1 = c_name.field_2._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nstatic PHP_METHOD($c_name$, __construct) {\n  $file_c_name$_AddDescriptor();\n  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n}\n\n"
            );
  this_00 = Descriptor::file(message);
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_168,(_anonymous_namespace_ *)this_00,file);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
  io::Printer::Print<char[12],std::__cxx11::string,char[7],std::__cxx11::string>
            ((Printer *)uVar1,local_148,(char (*) [12])"file_c_name",pbVar8,(char (*) [7])0x6b7b30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_168);
  field._4_4_ = 0;
  while( true ) {
    iVar4 = field._4_4_;
    iVar2 = Descriptor::field_count(message);
    uVar7 = SUB81(pbVar8,0);
    if (iVar2 <= iVar4) break;
    local_178 = Descriptor::field(message,field._4_4_);
    uVar1 = c_name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,
               "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n      intern->desc->msgdef, \"$name$\");\n  zval ret;\n  Message_get(intern, f, &ret);\n  RETURN_COPY_VALUE(&ret);\n}\n\nstatic PHP_METHOD($c_name$, set$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n      intern->desc->msgdef, \"$name$\");\n  zval *val;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n      == FAILURE) {\n    return;\n  }\n  Message_set(intern, f, val);\n  RETURN_COPY(getThis());\n}\n\n"
              );
    psVar5 = FieldDescriptor::name_abi_cxx11_(local_178);
    psVar6 = FieldDescriptor::name_abi_cxx11_(local_178);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    name._M_len = auVar9._8_8_;
    name._M_str = (char *)0x1;
    _auStack_1b8 = auVar9;
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              (&local_1a8,auVar9._0_8_,name,(bool)uVar7);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,local_188,(char (*) [7])0x6b7b30,pbVar8,(char (*) [5])0x6b980f,
               psVar5,(char (*) [11])0x62bf40,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    field._4_4_ = field._4_4_ + 1;
  }
  oneof._4_4_ = 0;
  while( true ) {
    iVar4 = oneof._4_4_;
    uVar7 = SUB81(pbVar8,0);
    iVar2 = Descriptor::real_oneof_decl_count(message);
    if (iVar2 <= iVar4) break;
    local_1c8 = Descriptor::oneof_decl(message,oneof._4_4_);
    uVar1 = c_name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d8,
               "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_OneofDef *oneof = upb_MessageDef_FindOneofByName(\n      intern->desc->msgdef, \"$name$\");\n  const upb_FieldDef *field = \n      upb_Message_WhichOneofByDef(intern->msg, oneof);\n  RETURN_STRING(field ? upb_FieldDef_Name(field) : \"\");\n}\n"
              );
    psVar5 = OneofDescriptor::name_abi_cxx11_(local_1c8);
    psVar6 = OneofDescriptor::name_abi_cxx11_(local_1c8);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    name_00._M_len = auVar9._8_8_;
    name_00._M_str = (char *)0x1;
    local_208 = auVar9;
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              (&local_1f8,auVar9._0_8_,name_00,(bool)uVar7);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,local_1d8,(char (*) [7])0x6b7b30,pbVar8,(char (*) [5])0x6b980f,
               psVar5,(char (*) [11])0x62bf40,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    oneof._4_4_ = oneof._4_4_ + 1;
  }
  WVar3 = Descriptor::well_known_type(message);
  uVar1 = c_name.field_2._8_8_;
  if (WVar3 == WELLKNOWNTYPE_ANY) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_218,
               "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n  ZEND_ARG_INFO(0, proto)\nZEND_END_ARG_INFO()\n\n"
              );
    io::Printer::Print<>((Printer *)uVar1,local_218);
  }
  else if (WVar3 == WELLKNOWNTYPE_TIMESTAMP) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_228,
               "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n  ZEND_ARG_INFO(0, datetime)\nZEND_END_ARG_INFO()\n\n"
              );
    io::Printer::Print<>((Printer *)uVar1,local_228);
  }
  uVar1 = c_name.field_2._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_238,
             "static zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n"
            );
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
  io::Printer::Print<char[7],std::__cxx11::string>
            ((Printer *)uVar1,_auStack_238,(char (*) [7])0x6b7b30,pbVar8);
  field_1._4_4_ = 0;
  while( true ) {
    iVar4 = field_1._4_4_;
    iVar2 = Descriptor::field_count(message);
    uVar7 = SUB81(pbVar8,0);
    if (iVar2 <= iVar4) break;
    local_248 = Descriptor::field(message,field_1._4_4_);
    uVar1 = c_name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_258,
               "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n"
              );
    psVar5 = FieldDescriptor::name_abi_cxx11_(local_248);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    name_01._M_len = auVar9._8_8_;
    name_01._M_str = (char *)0x1;
    _auStack_288 = auVar9;
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              (&local_278,auVar9._0_8_,name_01,(bool)uVar7);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,local_258,(char (*) [7])0x6b7b30,pbVar8,(char (*) [11])0x62bf40,
               &local_278);
    std::__cxx11::string::~string((string *)&local_278);
    field_1._4_4_ = field_1._4_4_ + 1;
  }
  oneof_1._4_4_ = 0;
  while( true ) {
    iVar4 = oneof_1._4_4_;
    uVar7 = SUB81(pbVar8,0);
    iVar2 = Descriptor::real_oneof_decl_count(message);
    if (iVar2 <= iVar4) break;
    local_298 = Descriptor::oneof_decl(message,oneof_1._4_4_);
    uVar1 = c_name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a8,"  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n");
    psVar5 = OneofDescriptor::name_abi_cxx11_(local_298);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    name_02._M_len = auVar9._8_8_;
    name_02._M_str = (char *)0x1;
    local_2d8 = auVar9;
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              (&local_2c8,auVar9._0_8_,name_02,(bool)uVar7);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,local_2a8,(char (*) [7])0x6b7b30,pbVar8,(char (*) [11])0x62bf40,
               &local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    oneof_1._4_4_ = oneof_1._4_4_ + 1;
  }
  WVar3 = Descriptor::well_known_type(message);
  uVar1 = c_name.field_2._8_8_;
  if (WVar3 == WELLKNOWNTYPE_ANY) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2e8,
               "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n"
              );
    io::Printer::Print<char[7],std::__cxx11::string>
              ((Printer *)uVar1,local_2e8,(char (*) [7])0x6b7b30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  else if (WVar3 == WELLKNOWNTYPE_TIMESTAMP) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2f8,
               "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n"
              );
    io::Printer::Print<char[7],std::__cxx11::string>
              ((Printer *)uVar1,local_2f8,(char (*) [7])0x6b7b30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  uVar1 = c_name.field_2._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&i_5,
             "  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n  $c_name$_ce->create_object = Message_create;\n  zend_do_inheritance($c_name$_ce, message_ce);\n}\n\n"
            );
  io::Printer::Print<char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            ((Printer *)uVar1,_i_5,(char (*) [7])0x6b7b30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [9])"php_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  local_30c = 0;
  while( true ) {
    iVar4 = Descriptor::nested_type_count(message);
    if (iVar4 <= local_30c) break;
    message_00 = Descriptor::nested_type(message,local_30c);
    GenerateCMessage(message_00,(Printer *)c_name.field_2._8_8_);
    local_30c = local_30c + 1;
  }
  local_310 = 0;
  while( true ) {
    iVar4 = Descriptor::enum_type_count(message);
    if (iVar4 <= local_310) break;
    desc = Descriptor::enum_type(message,local_310);
    GenerateCEnum(desc,(Printer *)c_name.field_2._8_8_);
    local_310 = local_310 + 1;
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenerateCMessage(const Descriptor* message, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(message->full_name(), {{".", "_"}});
  std::string php_name =
      absl::StrReplaceAll(FullClassName(message, Options()), {{"\\", "\\\\"}});
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "static PHP_METHOD($c_name$, __construct) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n"
      "}\n"
      "\n",
      "file_c_name", FilenameCName(message->file()), "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
        "static PHP_METHOD($c_name$, get$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  zval ret;\n"
        "  Message_get(intern, f, &ret);\n"
        "  RETURN_COPY_VALUE(&ret);\n"
        "}\n"
        "\n"
        "static PHP_METHOD($c_name$, set$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  zval *val;\n"
        "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n"
        "      == FAILURE) {\n"
        "    return;\n"
        "  }\n"
        "  Message_set(intern, f, val);\n"
        "  RETURN_COPY(getThis());\n"
        "}\n"
        "\n",
        "c_name", c_name, "name", field->name(), "camel_name",
        UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
        "static PHP_METHOD($c_name$, get$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_OneofDef *oneof = upb_MessageDef_FindOneofByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  const upb_FieldDef *field = \n"
        "      upb_Message_WhichOneofByDef(intern->msg, oneof);\n"
        "  RETURN_STRING(field ? upb_FieldDef_Name(field) : \"\");\n"
        "}\n",
        "c_name", c_name, "name", oneof->name(), "camel_name",
        UnderscoresToCamelCase(oneof->name(), true));
  }

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, proto)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n");
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, datetime)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n");
      break;
    default:
      break;
  }

  printer->Print(
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
        "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, set$camel_name$, arginfo_setter, "
        "ZEND_ACC_PUBLIC)\n",
        "c_name", c_name, "camel_name",
        UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
        "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name, "camel_name",
        UnderscoresToCamelCase(oneof->name(), true));
  }

  // Extra hand-written functions added to the well-known types.
  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n",
          "c_name", c_name);
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, "
          "ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n",
          "c_name", c_name);
      break;
    default:
      break;
  }

  printer->Print(
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
      "  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n"
      "  $c_name$_ce->create_object = Message_create;\n"
      "  zend_do_inheritance($c_name$_ce, message_ce);\n"
      "}\n"
      "\n",
      "c_name", c_name, "php_name", php_name);

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateCMessage(message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateCEnum(message->enum_type(i), printer);
  }
}